

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

int ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  EVP_PKEY_CTX *sig_00;
  int extraout_EAX;
  EVP_PKEY_CTX *ctx_00;
  Reporter *siglen_00;
  Options *in_stack_ffffffffffffffa8;
  __shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  __shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  local_20 [16];
  Options *local_10;
  EVP_PKEY_CTX *local_8;
  
  this = local_20;
  local_10 = (Options *)sig;
  local_8 = ctx;
  Options::getNamer(in_stack_ffffffffffffffa8);
  ctx_00 = (EVP_PKEY_CTX *)
           ::std::
           __shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(this);
  sig_00 = local_8;
  siglen_00 = Options::getReporter(local_10);
  FileApprover::verify(ctx_00,(uchar *)sig_00,(size_t)siglen_00,tbs,tbslen);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x1177ac);
  return extraout_EAX;
}

Assistant:

static void verify(const ApprovalWriter& writer,
                           const Options& options = Options())
        {
            FileApprover::verify(*options.getNamer(), writer, options.getReporter());
        }